

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void av1_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  transform_1d_avx2_conflict2 p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int8_t *piVar6;
  bool bVar7;
  uint uVar8;
  int16_t *piVar9;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000009;
  long lVar12;
  __m256i *palVar13;
  int iVar14;
  __m256i *palVar15;
  ulong uVar16;
  longlong *plVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  __m256i out1 [64];
  __m256i buf1 [128];
  __m256i buf0 [128];
  undefined8 auStack_2860 [2];
  undefined8 auStack_2850 [254];
  longlong local_2060 [8];
  longlong local_2020 [504];
  longlong local_1060 [4];
  longlong local_1040 [514];
  
  piVar6 = av1_fwd_txfm_shift_ls[3];
  p_Var2 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  lVar11 = 0;
  bVar18 = true;
  do {
    bVar7 = bVar18;
    piVar9 = input + lVar11 * 0x10;
    lVar12 = 0;
    do {
      uVar3 = *(undefined8 *)(piVar9 + 4);
      uVar4 = *(undefined8 *)(piVar9 + 8);
      uVar5 = *(undefined8 *)(piVar9 + 0xc);
      *(undefined8 *)((long)auStack_2860 + lVar12) = *(undefined8 *)piVar9;
      *(undefined8 *)((long)auStack_2860 + lVar12 + 8) = uVar3;
      *(undefined8 *)((long)auStack_2850 + lVar12) = uVar4;
      *(undefined8 *)((long)auStack_2850 + lVar12 + 8) = uVar5;
      lVar12 = lVar12 + 0x20;
      piVar9 = piVar9 + stride;
    } while (lVar12 != 0x400);
    palVar13 = (__m256i *)(local_1060 + lVar11 * 8);
    lVar12 = lVar11 * 0x40 + -0x1040;
    lVar10 = 0;
    do {
      auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)auStack_2860 + lVar10));
      auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)auStack_2850 + lVar10));
      *(undefined1 (*) [32])((long)local_1060 + lVar10 * 4 + lVar11 * 0x40) = auVar19;
      *(undefined1 (*) [32])((long)local_1040 + lVar10 * 4 + lVar12 + 0x1040) = auVar20;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
    bVar1 = *piVar6;
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      iVar14 = 1 << (~bVar1 & 0x1f);
      auVar19._4_4_ = iVar14;
      auVar19._0_4_ = iVar14;
      auVar19._8_4_ = iVar14;
      auVar19._12_4_ = iVar14;
      auVar19._16_4_ = iVar14;
      auVar19._20_4_ = iVar14;
      auVar19._24_4_ = iVar14;
      auVar19._28_4_ = iVar14;
      lVar10 = 0;
      do {
        auVar20 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])((long)*palVar13 + lVar10));
        auVar20 = vpsrad_avx2(auVar20,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1000);
LAB_00481c39:
      palVar15 = (__m256i *)(local_1040 + lVar11 * 8);
      if ((char)bVar1 < '\0') {
        iVar14 = 1 << (~bVar1 & 0x1f);
        auVar20._4_4_ = iVar14;
        auVar20._0_4_ = iVar14;
        auVar20._8_4_ = iVar14;
        auVar20._12_4_ = iVar14;
        auVar20._16_4_ = iVar14;
        auVar20._20_4_ = iVar14;
        auVar20._24_4_ = iVar14;
        auVar20._28_4_ = iVar14;
        lVar11 = 0;
        do {
          auVar19 = vpaddd_avx2(auVar20,*(undefined1 (*) [32])
                                         ((long)local_1040 + lVar11 + lVar12 + 0x1040));
          auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)local_1040 + lVar11 + lVar12 + 0x1040) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
      else if (bVar1 != 0) {
        lVar11 = 0;
        do {
          auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)local_1040 + lVar11 + lVar12 + 0x1040),
                                ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)local_1040 + lVar11 + lVar12 + 0x1040) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
    }
    else {
      if (bVar1 != 0) {
        lVar10 = 0;
        do {
          auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar13 + lVar10),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar13 + lVar10) = auVar19;
          lVar10 = lVar10 + 0x80;
        } while (lVar10 != 0x1000);
        goto LAB_00481c39;
      }
      palVar15 = (__m256i *)(local_1040 + lVar11 * 8);
    }
    (*p_Var2)(palVar13,palVar13,'\f',4,4);
    (*p_Var2)(palVar15,palVar15,'\f',4,4);
    bVar1 = piVar6[1];
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      iVar14 = 1 << (~bVar1 & 0x1f);
      auVar21._4_4_ = iVar14;
      auVar21._0_4_ = iVar14;
      auVar21._8_4_ = iVar14;
      auVar21._12_4_ = iVar14;
      auVar21._16_4_ = iVar14;
      auVar21._20_4_ = iVar14;
      auVar21._24_4_ = iVar14;
      auVar21._28_4_ = iVar14;
      lVar11 = 0;
      do {
        auVar19 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])((long)*palVar13 + lVar11));
        auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
LAB_00481d5d:
      if ((char)bVar1 < '\0') {
        iVar14 = 1 << (~bVar1 & 0x1f);
        auVar22._4_4_ = iVar14;
        auVar22._0_4_ = iVar14;
        auVar22._8_4_ = iVar14;
        auVar22._12_4_ = iVar14;
        auVar22._16_4_ = iVar14;
        auVar22._20_4_ = iVar14;
        auVar22._24_4_ = iVar14;
        auVar22._28_4_ = iVar14;
        lVar11 = 0;
        do {
          auVar19 = vpaddd_avx2(auVar22,*(undefined1 (*) [32])((long)*palVar15 + lVar11));
          auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)*palVar15 + lVar11) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
      else if (bVar1 != 0) {
        lVar11 = 0;
        do {
          auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar15 + lVar11),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar15 + lVar11) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar13 + lVar11),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
      goto LAB_00481d5d;
    }
    lVar11 = 1;
    bVar18 = false;
  } while (bVar7);
  palVar13 = (__m256i *)local_2060;
  plVar17 = local_1060;
  uVar16 = 0;
  do {
    lVar11 = 0;
    palVar15 = palVar13;
    do {
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar17 + lVar11),palVar15,4,4);
      palVar15 = palVar15 + 0x20;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    palVar13 = palVar13 + 1;
    plVar17 = plVar17 + 0x80;
    bVar18 = uVar16 < 0x18;
    uVar16 = uVar16 + 8;
  } while (bVar18);
  lVar11 = 1;
  palVar13 = (__m256i *)local_2060;
  bVar18 = true;
  do {
    (*p_Var2)(palVar13,palVar13,'\f',4,4);
    palVar15 = (__m256i *)(local_2060 + lVar11 * 4);
    (*p_Var2)(palVar15,palVar15,'\f',4,4);
    bVar1 = piVar6[2];
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      iVar14 = 1 << (~bVar1 & 0x1f);
      auVar23._4_4_ = iVar14;
      auVar23._0_4_ = iVar14;
      auVar23._8_4_ = iVar14;
      auVar23._12_4_ = iVar14;
      auVar23._16_4_ = iVar14;
      auVar23._20_4_ = iVar14;
      auVar23._24_4_ = iVar14;
      auVar23._28_4_ = iVar14;
      lVar11 = 0;
      do {
        auVar19 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])((long)*palVar13 + lVar11));
        auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
LAB_00481f06:
      if ((char)bVar1 < '\0') {
        iVar14 = 1 << (~bVar1 & 0x1f);
        auVar24._4_4_ = iVar14;
        auVar24._0_4_ = iVar14;
        auVar24._8_4_ = iVar14;
        auVar24._12_4_ = iVar14;
        auVar24._16_4_ = iVar14;
        auVar24._20_4_ = iVar14;
        auVar24._24_4_ = iVar14;
        auVar24._28_4_ = iVar14;
        lVar11 = 0;
        do {
          auVar19 = vpaddd_avx2(auVar24,*(undefined1 (*) [32])((long)*palVar15 + lVar11));
          auVar19 = vpsrad_avx2(auVar19,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)*palVar15 + lVar11) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
      else if (bVar1 != 0) {
        lVar11 = 0;
        do {
          auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar15 + lVar11),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar15 + lVar11) = auVar19;
          lVar11 = lVar11 + 0x80;
        } while (lVar11 != 0x1000);
      }
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar19 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar13 + lVar11),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x80;
      } while (lVar11 != 0x1000);
      goto LAB_00481f06;
    }
    lVar11 = 3;
    palVar13 = (__m256i *)local_2020;
    bVar7 = !bVar18;
    bVar18 = false;
    if (bVar7) {
      memcpy(output,local_2060,0x1000);
      return;
    }
  } while( true );
}

Assistant:

void av1_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[128], buf1[128];
  const int tx_size = TX_32X32;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x32_arr[tx_type];
  int r, c;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[(i << 1)], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[(i << 1)], &buf0[(i << 1)], cos_bit_col, width_div8,
             width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < width_div16; i++) {
    row_txfm(&buf1[(i << 1)], &buf1[(i << 1)], cos_bit_row, width_div8,
             width_div8);
    row_txfm(&buf1[(i << 1) + 1], &buf1[(i << 1) + 1], cos_bit_row, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1)], height, shift[2], width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1) + 1], height, shift[2], width_div8);
  }

  store_buffer_avx2(buf1, output, 8, 128);
}